

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall
Args::CmdLine::savePositionalArguments(CmdLine *this,String *word,bool splitted,bool valuePrepended)

{
  pointer pcVar1;
  pointer pbVar2;
  value_type *__x;
  long *plVar3;
  int iVar4;
  pointer pbVar5;
  undefined7 in_register_00000011;
  bool bVar6;
  String tmp;
  value_type local_68;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  pcVar1 = (word->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + word->_M_string_length);
  if ((int)CONCAT71(in_register_00000011,splitted) != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_68._M_string_length,0,'\x01');
    if (valuePrepended) {
      pbVar5 = (this->m_context).m_context.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (this->m_context).m_it._M_current;
      if (pbVar2 != pbVar5) {
        (this->m_context).m_it._M_current = pbVar2 + 1;
        pbVar5 = pbVar2;
      }
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)(pbVar5->_M_dataplus)._M_p);
    }
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,'\x02');
  plVar3 = local_48;
  if (local_68._M_string_length == local_40) {
    if (local_68._M_string_length == 0) {
      bVar6 = false;
    }
    else {
      iVar4 = bcmp(local_68._M_dataplus._M_p,local_48,local_68._M_string_length);
      bVar6 = iVar4 != 0;
    }
  }
  else {
    bVar6 = true;
  }
  if (plVar3 != local_38) {
    operator_delete(plVar3,local_38[0] + 1);
  }
  if (bVar6) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,&local_68);
  }
  while (__x = (this->m_context).m_it._M_current,
        __x != (this->m_context).m_context.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    (this->m_context).m_it._M_current = __x + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,__x);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void savePositionalArguments( const String & word, bool splitted, bool valuePrepended )
	{
		auto tmp = word;

		if( splitted )
		{
			tmp.append( 1, '=' );

			if( valuePrepended )
				tmp.append( *m_context.next() );
		}

		if( tmp != String( 2, '-' ) )
			m_positional.push_back( tmp );

		while( !m_context.atEnd() )
		{
			auto it = m_context.next();

			m_positional.push_back( *it );
		}
	}